

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_asn1.cc
# Opt level: O3

RSA * d2i_RSA_PUBKEY(RSA **a,uchar **pp,long length)

{
  EVP_PKEY *pkey;
  rsa_st *prVar1;
  CBS cbs;
  CBS local_30;
  
  if (-1 < length) {
    local_30.data = *pp;
    local_30.len = length;
    pkey = (EVP_PKEY *)EVP_parse_public_key(&local_30);
    if (pkey != (EVP_PKEY *)0x0) {
      prVar1 = EVP_PKEY_get1_RSA(pkey);
      if (prVar1 != (rsa_st *)0x0) {
        if (a != (RSA **)0x0) {
          RSA_free(*a);
          *a = prVar1;
        }
        *pp = local_30.data;
      }
      EVP_PKEY_free(pkey);
      return prVar1;
    }
  }
  return (RSA *)0x0;
}

Assistant:

RSA *d2i_RSA_PUBKEY(RSA **out, const uint8_t **inp, long len) {
  if (len < 0) {
    return nullptr;
  }
  CBS cbs;
  CBS_init(&cbs, *inp, (size_t)len);
  bssl::UniquePtr<EVP_PKEY> pkey(EVP_parse_public_key(&cbs));
  if (pkey == nullptr) {
    return nullptr;
  }
  bssl::UniquePtr<RSA> rsa(EVP_PKEY_get1_RSA(pkey.get()));
  if (rsa == nullptr) {
    return nullptr;
  }
  if (out != nullptr) {
    RSA_free(*out);
    *out = rsa.get();
  }
  *inp = CBS_data(&cbs);
  return rsa.release();
}